

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

void soplex::LPFwriteSVector<double>
               (SPxLPBase<double> *p_lp,ostream *p_output,NameSet *p_cnames,
               SVectorBase<double> *p_svec,bool writeZeroCoefficients)

{
  Nonzero<double> *pNVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  size_t sVar5;
  int p_idx;
  long lVar6;
  int iVar7;
  double dVar8;
  char name [16];
  char local_48 [24];
  
  iVar2 = (p_lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
  if (0 < iVar2) {
    iVar7 = 0;
    p_idx = 0;
    do {
      pNVar1 = p_svec->m_elem;
      dVar8 = 0.0;
      if ((pNVar1 != (Nonzero<double> *)0x0) && (0 < (long)p_svec->memused)) {
        lVar6 = 0;
        do {
          if (*(int *)((long)&pNVar1->idx + lVar6) == p_idx) {
            dVar8 = *(double *)((long)&pNVar1->val + lVar6);
            goto LAB_00178f9d;
          }
          lVar6 = lVar6 + 0x10;
        } while ((long)p_svec->memused * 0x10 != lVar6);
        dVar8 = 0.0;
      }
LAB_00178f9d:
      if (dVar8 != 0.0 || writeZeroCoefficients) {
        if (iVar7 == 0) {
          poVar3 = std::ostream::_M_insert<double>(dVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          pcVar4 = getColName<double>((SPxLPBase<double> *)
                                      (p_lp->super_LPColSetBase<double>).super_SVSetBase<double>.set
                                      .thekey,p_idx,p_cnames,local_48);
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
          }
          else {
            sVar5 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar4,sVar5);
          }
        }
        else {
          if (iVar7 * -0x33333333 + 0x19999999U < 0x33333333) {
            std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n\t",2);
          }
          if (0.0 <= dVar8) {
            std::__ostream_insert<char,std::char_traits<char>>(p_output," + ",3);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(p_output," - ",3);
            dVar8 = -dVar8;
          }
          std::ostream::_M_insert<double>(dVar8);
          std::__ostream_insert<char,std::char_traits<char>>(p_output," ",1);
          pcVar4 = getColName<double>((SPxLPBase<double> *)
                                      (p_lp->super_LPColSetBase<double>).super_SVSetBase<double>.set
                                      .thekey,p_idx,p_cnames,local_48);
          if (pcVar4 == (char *)0x0) {
            std::ios::clear((int)p_output + (int)*(undefined8 *)(*(long *)p_output + -0x18));
          }
          else {
            sVar5 = strlen(pcVar4);
            std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar4,sVar5);
          }
        }
        iVar7 = iVar7 + 1;
        iVar2 = (p_lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
      }
      p_idx = p_idx + 1;
    } while (p_idx < iVar2);
  }
  return;
}

Assistant:

static void LPFwriteSVector(
   const SPxLPBase<R>&   p_lp,                         ///< the LP
   std::ostream&         p_output,                     ///< output stream
   const NameSet*        p_cnames,                     ///< column names
   const SVectorBase<R>& p_svec,                       ///< vector to write
   const bool            writeZeroCoefficients = false ///< write zero objective coefficients
)
{

   char name[16];
   int num_coeffs = 0;

   for(int j = 0; j < p_lp.nCols(); ++j)
   {
      const R coeff = p_svec[j];

      if(coeff == 0 && !writeZeroCoefficients)
         continue;

      if(num_coeffs == 0)
         p_output << coeff << " " << getColName(p_lp, j, p_cnames, name);
      else
      {
         // insert a line break every SOPLEX_NUM_ENTRIES_PER_LINE columns
         if(num_coeffs % SOPLEX_NUM_ENTRIES_PER_LINE == 0)
            p_output << "\n\t";

         if(coeff < 0)
            p_output << " - " << -coeff;
         else
            p_output << " + " << coeff;

         p_output << " " << getColName(p_lp, j, p_cnames, name);
      }

      ++num_coeffs;
   }
}